

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

CBString * __thiscall Bstrlib::CBStream::operator>>(CBStream *this,CBString *s)

{
  int iVar1;
  
  while( true ) {
    iVar1 = bseof(this->m_s);
    if (iVar1 != 0) break;
    iVar1 = bsreada(&s->super_tagbstring,this->m_s,0x400);
    if (iVar1 < 0) {
      eof(this);
    }
  }
  return s;
}

Assistant:

CBString& CBStream::operator >> (CBString& s) {
	while (!bseof (m_s)) {
		if (0 > bsreada ((bstring) &s, m_s, BS_BUFF_SZ) && eof () < 0) {
			bstringThrow ("Failed read");
		}
	}
	return s;
}